

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg_tools.cxx
# Opt level: O2

void __thiscall ogg_tools::process(ogg_tools *this,cl_parser *cl)

{
  bool bVar1;
  xr_file_system *this_00;
  allocator<char> local_31;
  string local_30;
  
  bVar1 = check_paths(this);
  if (bVar1) {
    this_00 = xray_re::xr_file_system::instance();
    xray_re::xr_file_system::resolve_path(this_00,"$game_sounds$");
    std::__cxx11::string::assign((char *)&this->m_sounds);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
    process_folder(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void ogg_tools::process(const cl_parser& cl)
{
	if (!check_paths())
		return;

	xr_file_system& fs = xr_file_system::instance();
	m_sounds = fs.resolve_path(PA_GAME_SOUNDS);

	process_folder();
}